

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::
BinaryExpr<int,_const_isocpp_p1950::indirect_value<int,_isocpp_p1950::default_copy<int>,_std::default_delete<int>_>_&>
::streamReconstructedExpression
          (BinaryExpr<int,_const_isocpp_p1950::indirect_value<int,_isocpp_p1950::default_copy<int>,_std::default_delete<int>_>_&>
           *this,ostream *os)

{
  int in_EDX;
  string *in_R9;
  StringRef op;
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  string local_38;
  
  StringMaker<int,void>::convert_abi_cxx11_
            (&local_38,
             (StringMaker<int,void> *)(ulong)*(uint *)&(this->super_ITransientExpression).field_0xc,
             in_EDX);
  local_48 = 0x7d3f7b;
  local_50 = 3;
  op.m_size = (size_type)&local_58;
  op.m_start = (char *)(this->m_op).m_size;
  local_58 = &local_48;
  formatReconstructedExpression
            ((Catch *)os,(ostream *)&local_38,(string *)(this->m_op).m_start,op,in_R9);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT44(uStack_44,local_48) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }